

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_hkdf_expand(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t prk,
                    ptls_iovec_t info)

{
  long lVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t off_end;
  size_t off_start;
  uint8_t gen;
  uint8_t digest [64];
  size_t i;
  ptls_hash_context_t *hmac;
  ulong local_a0;
  char local_89;
  undefined1 local_88 [32];
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  ptls_hash_algorithm_t *in_stack_ffffffffffffffa8;
  long local_40;
  st_ptls_hash_context_t *local_38;
  
  local_38 = (st_ptls_hash_context_t *)0x0;
  local_40 = 0;
  do {
    if (in_RDX <= (ulong)(local_40 * *(long *)(in_RDI + 8))) {
      if (local_38 != (st_ptls_hash_context_t *)0x0) {
        (*local_38->final)(local_38,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
      }
      (*ptls_clear_memory)(local_88,*(size_t *)(in_RDI + 8));
      return 0;
    }
    if (local_38 == (st_ptls_hash_context_t *)0x0) {
      local_38 = ptls_hmac_create(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                  in_stack_ffffffffffffff98);
      if (local_38 == (ptls_hash_context_t *)0x0) {
        return 0x201;
      }
    }
    else {
      (*local_38->update)(local_38,local_88,*(size_t *)(in_RDI + 8));
    }
    (*local_38->update)(local_38,(void *)off_end,off_start);
    local_89 = (char)local_40 + '\x01';
    (*local_38->update)(local_38,&local_89,1);
    (*local_38->final)(local_38,local_88,PTLS_HASH_FINAL_MODE_RESET);
    lVar1 = local_40 * *(long *)(in_RDI + 8);
    local_a0 = lVar1 + *(long *)(in_RDI + 8);
    if (in_RDX < local_a0) {
      local_a0 = in_RDX;
    }
    memcpy((void *)(in_RSI + lVar1),local_88,local_a0 - lVar1);
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int ptls_hkdf_expand(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t prk, ptls_iovec_t info)
{
    ptls_hash_context_t *hmac = NULL;
    size_t i;
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];

    for (i = 0; (i * algo->digest_size) < outlen; ++i) {
        if (hmac == NULL) {
            if ((hmac = ptls_hmac_create(algo, prk.base, prk.len)) == NULL)
                return PTLS_ERROR_NO_MEMORY;
        } else {
            hmac->update(hmac, digest, algo->digest_size);
        }
        hmac->update(hmac, info.base, info.len);
        uint8_t gen = (uint8_t)(i + 1);
        hmac->update(hmac, &gen, 1);
        hmac->final(hmac, digest, 1);

        size_t off_start = i * algo->digest_size, off_end = off_start + algo->digest_size;
        if (off_end > outlen)
            off_end = outlen;
        memcpy((uint8_t *)output + off_start, digest, off_end - off_start);
    }

    if (hmac != NULL)
        hmac->final(hmac, NULL, PTLS_HASH_FINAL_MODE_FREE);

    ptls_clear_memory(digest, algo->digest_size);

    return 0;
}